

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

uchar * DecompressData(uchar *compData,int compDataSize,int *dataSize)

{
  uint uVar1;
  uchar *out;
  uchar *puVar2;
  
  out = (uchar *)calloc(0x4000000,1);
  uVar1 = sinfl_decompress(out,0x4000000,compData,compDataSize);
  puVar2 = (uchar *)realloc(out,(long)(int)uVar1);
  if (puVar2 == (uchar *)0x0) {
    TraceLog(4,"SYSTEM: Failed to re-allocate required decompression memory");
    puVar2 = out;
  }
  *dataSize = uVar1;
  TraceLog(3,"SYSTEM: Decompress data: Comp. size: %i -> Original size: %i",compDataSize,
           (ulong)uVar1);
  return puVar2;
}

Assistant:

unsigned char *DecompressData(const unsigned char *compData, int compDataSize, int *dataSize)
{
    unsigned char *data = NULL;

#if defined(SUPPORT_COMPRESSION_API)
    // Decompress data from a valid DEFLATE stream
    data = (unsigned char *)RL_CALLOC(MAX_DECOMPRESSION_SIZE*1024*1024, 1);
    int length = sinflate(data, MAX_DECOMPRESSION_SIZE*1024*1024, compData, compDataSize);

    // WARNING: RL_REALLOC can make (and leave) data copies in memory, be careful with sensitive compressed data!
    // TODO: Use a different approach, create another buffer, copy data manually to it and wipe original buffer memory
    unsigned char *temp = (unsigned char *)RL_REALLOC(data, length);

    if (temp != NULL) data = temp;
    else TRACELOG(LOG_WARNING, "SYSTEM: Failed to re-allocate required decompression memory");

    *dataSize = length;

    TRACELOG(LOG_INFO, "SYSTEM: Decompress data: Comp. size: %i -> Original size: %i", compDataSize, *dataSize);
#endif

    return data;
}